

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O0

longlong __thiscall
cmsys::SystemInformationImplementation::GetProcMemoryUsed(SystemInformationImplementation *this)

{
  int iVar1;
  SystemInformationImplementation *pSStack_20;
  int ierr;
  longlong memUsed;
  SystemInformationImplementation *this_local;
  
  pSStack_20 = (SystemInformationImplementation *)0x0;
  memUsed = (longlong)this;
  iVar1 = anon_unknown_3::GetFieldFromFile<long_long>
                    ("/proc/self/status","VmRSS:",(longlong *)&stack0xffffffffffffffe0);
  if (iVar1 == 0) {
    this_local = pSStack_20;
  }
  else {
    this_local = (SystemInformationImplementation *)0xffffffffffffffff;
  }
  return (longlong)this_local;
}

Assistant:

long long SystemInformationImplementation::GetProcMemoryUsed()
{
#if defined(_WIN32) && defined(KWSYS_SYS_HAS_PSAPI)
  long pid = GetCurrentProcessId();
  HANDLE hProc;
  hProc = OpenProcess(PROCESS_QUERY_INFORMATION | PROCESS_VM_READ, false, pid);
  if (hProc == 0) {
    return -1;
  }
  PROCESS_MEMORY_COUNTERS pmc;
  int ok = GetProcessMemoryInfo(hProc, &pmc, sizeof(pmc));
  CloseHandle(hProc);
  if (!ok) {
    return -2;
  }
  return pmc.WorkingSetSize / 1024;
#elif defined(__linux) || defined(__CYGWIN__)
  long long memUsed = 0;
  int ierr = GetFieldFromFile("/proc/self/status", "VmRSS:", memUsed);
  if (ierr) {
    return -1;
  }
  return memUsed;
#elif defined(__APPLE__)
  long long memUsed = 0;
  pid_t pid = getpid();
  std::ostringstream oss;
  oss << "ps -o rss= -p " << pid;
  FILE* file = popen(oss.str().c_str(), "r");
  if (file == nullptr) {
    return -1;
  }
  oss.str("");
  while (!feof(file) && !ferror(file)) {
    char buf[256] = { '\0' };
    errno = 0;
    size_t nRead = fread(buf, 1, 256, file);
    if (ferror(file) && (errno == EINTR)) {
      clearerr(file);
    }
    if (nRead)
      oss << buf;
  }
  int ierr = ferror(file);
  pclose(file);
  if (ierr) {
    return -2;
  }
  std::istringstream iss(oss.str());
  iss >> memUsed;
  return memUsed;
#else
  return 0;
#endif
}